

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTD_DDict *
ZSTD_initStaticDDict
          (void *sBuffer,size_t sBufferSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType)

{
  size_t sVar1;
  ZSTD_DDict *pZVar2;
  ulong uVar3;
  void *__dest;
  
  uVar3 = dictSize + 0x6860;
  if (dictLoadMethod == ZSTD_dlm_byRef) {
    uVar3 = 0x6860;
  }
  if (sBuffer != (void *)0x0) {
    if (dict != (void *)0x0) {
      pZVar2 = (ZSTD_DDict *)0x0;
      if ((((ulong)sBuffer & 7) == 0) && (uVar3 <= sBufferSize)) {
        __dest = dict;
        if (dictLoadMethod == ZSTD_dlm_byCopy) {
          __dest = (void *)((long)sBuffer + 0x6860);
          memcpy(__dest,dict,dictSize);
        }
        sVar1 = ZSTD_initDDict_internal
                          ((ZSTD_DDict *)sBuffer,__dest,dictSize,ZSTD_dlm_byRef,dictContentType);
        pZVar2 = (ZSTD_DDict *)0x0;
        if (sVar1 < 0xffffffffffffff89) {
          pZVar2 = (ZSTD_DDict *)sBuffer;
        }
      }
      return pZVar2;
    }
    __assert_fail("dict != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5936,
                  "const ZSTD_DDict *ZSTD_initStaticDDict(void *, size_t, const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e)"
                 );
  }
  __assert_fail("sBuffer != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x5935,
                "const ZSTD_DDict *ZSTD_initStaticDDict(void *, size_t, const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e)"
               );
}

Assistant:

const ZSTD_DDict* ZSTD_initStaticDDict(
                                void* sBuffer, size_t sBufferSize,
                                const void* dict, size_t dictSize,
                                ZSTD_dictLoadMethod_e dictLoadMethod,
                                ZSTD_dictContentType_e dictContentType)
{
    size_t const neededSpace = sizeof(ZSTD_DDict)
                             + (dictLoadMethod == ZSTD_dlm_byRef ? 0 : dictSize);
    ZSTD_DDict* const ddict = (ZSTD_DDict*)sBuffer;
    assert(sBuffer != NULL);
    assert(dict != NULL);
    if ((size_t)sBuffer & 7) return NULL;   /* 8-aligned */
    if (sBufferSize < neededSpace) return NULL;
    if (dictLoadMethod == ZSTD_dlm_byCopy) {
        memcpy(ddict+1, dict, dictSize);  /* local copy */
        dict = ddict+1;
    }
    if (ZSTD_isError( ZSTD_initDDict_internal(ddict,
                                              dict, dictSize,
                                              ZSTD_dlm_byRef, dictContentType) ))
        return NULL;
    return ddict;
}